

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O1

Vec4 __thiscall
deqp::gles2::Functional::calculateLodDerivateParts(Functional *this,Mat3 *transformation)

{
  int row;
  long lVar1;
  Vector<float,_3> *pVVar2;
  Vector<float,_3> *pVVar3;
  int col;
  long lVar4;
  int col_2;
  int col_1;
  float v;
  float fVar5;
  Vec4 VVar6;
  Vector<float,_3> res;
  float local_34 [3];
  Vector<float,_3> *local_28;
  float local_20 [2];
  Vec2 trans10;
  Vec2 trans01;
  Vec2 trans00;
  
  lVar1 = 0;
  local_34[0] = 0.0;
  local_34[1] = 0.0;
  local_34[2] = 1.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  pVVar2 = (Vector<float,_3> *)transformation;
  do {
    fVar5 = 0.0;
    lVar4 = 0;
    pVVar3 = pVVar2;
    do {
      fVar5 = fVar5 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data[0] *
                      local_34[lVar4];
      lVar4 = lVar4 + 1;
      pVVar3 = pVVar3 + 1;
    } while (lVar4 != 3);
    res.m_data[lVar1] = fVar5;
    lVar1 = lVar1 + 1;
    pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
  } while (lVar1 != 3);
  local_28 = &res;
  local_20[0] = 0.0;
  local_20[1] = 1.4013e-45;
  trans00.m_data[0] = 0.0;
  trans00.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    trans00.m_data[lVar1] = res.m_data[(int)(&trans10)[-1].m_data[lVar1]];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_34[0] = 0.0;
  local_34[1] = 1.0;
  local_34[2] = 1.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar1 = 0;
  pVVar2 = (Vector<float,_3> *)transformation;
  do {
    fVar5 = 0.0;
    lVar4 = 0;
    pVVar3 = pVVar2;
    do {
      fVar5 = fVar5 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar3->m_data)->m_data[0].m_data[0] *
                      local_34[lVar4];
      lVar4 = lVar4 + 1;
      pVVar3 = pVVar3 + 1;
    } while (lVar4 != 3);
    res.m_data[lVar1] = fVar5;
    lVar1 = lVar1 + 1;
    pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
  } while (lVar1 != 3);
  local_20[0] = 0.0;
  local_20[1] = 1.4013e-45;
  trans01.m_data[0] = 0.0;
  trans01.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    trans01.m_data[lVar1] = res.m_data[(int)(&trans10)[-1].m_data[lVar1]];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_34[0] = 1.0;
  local_34[1] = 0.0;
  local_34[2] = 1.0;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    fVar5 = 0.0;
    lVar4 = 0;
    pVVar2 = (Vector<float,_3> *)transformation;
    do {
      fVar5 = fVar5 + ((Vector<tcu::Vector<float,_3>,_3> *)pVVar2->m_data)->m_data[0].m_data[0] *
                      local_34[lVar4];
      lVar4 = lVar4 + 1;
      pVVar2 = pVVar2 + 1;
    } while (lVar4 != 3);
    res.m_data[lVar1] = fVar5;
    lVar1 = lVar1 + 1;
    transformation = (Mat3 *)(((Vector<float,_3> *)transformation)->m_data + 1);
  } while (lVar1 != 3);
  local_20[0] = 0.0;
  local_20[1] = 1.4013e-45;
  trans10.m_data[0] = 0.0;
  trans10.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    trans10.m_data[lVar1] = res.m_data[(int)(&trans10)[-1].m_data[lVar1]];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  VVar6.m_data[0] = trans10.m_data[0] - trans00.m_data[0];
  VVar6.m_data[1] = 0.0;
  VVar6.m_data[2] = trans10.m_data[1] - trans00.m_data[1];
  *(float *)this = VVar6.m_data[0];
  *(float *)(this + 4) = trans01.m_data[0] - trans00.m_data[0];
  *(float *)(this + 8) = VVar6.m_data[2];
  *(float *)(this + 0xc) = trans01.m_data[1] - trans00.m_data[1];
  VVar6.m_data[3] = 0.0;
  return (Vec4)VVar6.m_data;
}

Assistant:

static Vec4 calculateLodDerivateParts(const Mat3& transformation)
{
	// Calculate transformed coordinates of three corners.
	Vec2 trans00 = (transformation * Vec3(0.0f, 0.0f, 1.0f)).xy();
	Vec2 trans01 = (transformation * Vec3(0.0f, 1.0f, 1.0f)).xy();
	Vec2 trans10 = (transformation * Vec3(1.0f, 0.0f, 1.0f)).xy();

	return Vec4(trans10.x() - trans00.x(),
				trans01.x() - trans00.x(),
				trans10.y() - trans00.y(),
				trans01.y() - trans00.y());
}